

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVectorPruning.cpp
# Opt level: O0

bool AlphaVectorPruning::ParetoDominates(AlphaVector *x,AlphaVector *y)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 uVar4;
  double dVar5;
  Index i;
  double in_stack_ffffffffffffffa8;
  Index i_00;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  E *in_stack_ffffffffffffffe0;
  
  uVar1 = AlphaVector::GetNrValues((AlphaVector *)0x91d84d);
  uVar2 = AlphaVector::GetNrValues((AlphaVector *)0x91d85b);
  if (uVar1 != uVar2) {
    uVar4 = __cxa_allocate_exception(0x28);
    E::E(in_stack_ffffffffffffffe0,
         (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    __cxa_throw(uVar4,&E::typeinfo,E::~E);
  }
  uVar1 = 0;
  while( true ) {
    i_00 = (Index)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
    uVar2 = uVar1;
    uVar3 = AlphaVector::GetNrValues((AlphaVector *)0x91d8d4);
    if (uVar3 <= uVar1) {
      return true;
    }
    in_stack_ffffffffffffffa8 =
         AlphaVector::GetValue((AlphaVector *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),i_00);
    dVar5 = AlphaVector::GetValue
                      ((AlphaVector *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                       (Index)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    if (dVar5 < in_stack_ffffffffffffffa8) break;
    uVar1 = uVar2 + 1;
  }
  return false;
}

Assistant:

bool AlphaVectorPruning::ParetoDominates(AlphaVector x, AlphaVector y)
{
    if(x.GetNrValues()!=y.GetNrValues())
        throw(E("unequal length Pareto test"));

    for(Index i=0; i<x.GetNrValues(); ++i)
        if(y.GetValue(i)>x.GetValue(i))
            return(false);

    return(true);
}